

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

ProcessingResult * __thiscall
HeadersSyncState::ProcessNextHeaders
          (ProcessingResult *__return_storage_ptr__,HeadersSyncState *this,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *received_headers,
          bool full_headers_message)

{
  State SVar1;
  pointer pCVar2;
  bool bVar3;
  char *fmt;
  Level level;
  HeadersSyncState *category;
  _Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_> *category_00;
  int source_line;
  long lVar4;
  const_iterator __end3;
  const_iterator __begin3;
  pointer header;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_> _Stack_48;
  long local_30;
  
  level = (Level)&_Stack_48;
  category_00 = &_Stack_48;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->pow_validated_headers).
           super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->pow_validated_headers).
           super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (__return_storage_ptr__->pow_validated_headers).
  super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->pow_validated_headers).
  super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  header = (received_headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (received_headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((header != pCVar2) && (SVar1 = this->m_download_state, SVar1 != FINAL)) {
    if (SVar1 == REDOWNLOAD) {
      __return_storage_ptr__->success = true;
      do {
        if (header == pCVar2) {
          if ((__return_storage_ptr__->success & 1U) == 0) goto LAB_006c61ea;
          PopHeadersReadyForAcceptance
                    ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)&_Stack_48,this);
          std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::_M_move_assign
                    (&__return_storage_ptr__->pow_validated_headers);
          std::_Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>::~_Vector_base(&_Stack_48);
          if (((this->m_redownloaded_headers).
               super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur ==
               (this->m_redownloaded_headers).
               super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur) &&
             (this->m_process_all_remaining_headers == true)) {
            bVar3 = ::LogAcceptCategory((LogFlags)category_00,level);
            if (!bVar3) goto LAB_006c61ea;
            fmt = 
            "Initial headers sync complete with peer=%d: releasing all at height=%i (redownload phase)\n"
            ;
            source_line = 0x7a;
          }
          else {
            if (full_headers_message) goto LAB_006c6199;
            bVar3 = ::LogAcceptCategory((LogFlags)category_00,level);
            if (!bVar3) goto LAB_006c61ea;
            fmt = 
            "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (redownload phase)\n"
            ;
            source_line = 0x83;
          }
          lVar4 = 0x178;
          goto LAB_006c61bb;
        }
        bVar3 = ValidateAndStoreRedownloadedHeader(this,header);
        header = header + 1;
      } while (bVar3);
      __return_storage_ptr__->success = false;
    }
    else if (SVar1 == PRESYNC) {
      category = this;
      bVar3 = ValidateAndStoreHeadersCommitments(this,received_headers);
      __return_storage_ptr__->success = bVar3;
      if (bVar3) {
        if ((full_headers_message) || (this->m_download_state == REDOWNLOAD)) {
LAB_006c6199:
          __return_storage_ptr__->request_more = true;
        }
        else {
          bVar3 = ::LogAcceptCategory((LogFlags)category,(Level)received_headers);
          if (bVar3) {
            fmt = 
            "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (presync phase)\n"
            ;
            source_line = 0x60;
            lVar4 = 0x120;
LAB_006c61bb:
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
            ;
            source_file._M_len = 0x5f;
            logging_function._M_str = "ProcessNextHeaders";
            logging_function._M_len = 0x12;
            LogPrintFormatInternal<long,long>
                      (logging_function,source_file,source_line,NET,Debug,
                       (ConstevalFormatString<2U>)fmt,&this->m_id,
                       (long *)((long)&((HeadersSyncState *)(&this->m_minimum_required_work + -1))->
                                       m_commit_offset + lVar4));
          }
        }
      }
    }
LAB_006c61ea:
    if ((__return_storage_ptr__->success != true) || (__return_storage_ptr__->request_more == false)
       ) {
      Finalize(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

HeadersSyncState::ProcessingResult HeadersSyncState::ProcessNextHeaders(const
        std::vector<CBlockHeader>& received_headers, const bool full_headers_message)
{
    ProcessingResult ret;

    Assume(!received_headers.empty());
    if (received_headers.empty()) return ret;

    Assume(m_download_state != State::FINAL);
    if (m_download_state == State::FINAL) return ret;

    if (m_download_state == State::PRESYNC) {
        // During PRESYNC, we minimally validate block headers and
        // occasionally add commitments to them, until we reach our work
        // threshold (at which point m_download_state is updated to REDOWNLOAD).
        ret.success = ValidateAndStoreHeadersCommitments(received_headers);
        if (ret.success) {
            if (full_headers_message || m_download_state == State::REDOWNLOAD) {
                // A full headers message means the peer may have more to give us;
                // also if we just switched to REDOWNLOAD then we need to re-request
                // headers from the beginning.
                ret.request_more = true;
            } else {
                Assume(m_download_state == State::PRESYNC);
                // If we're in PRESYNC and we get a non-full headers
                // message, then the peer's chain has ended and definitely doesn't
                // have enough work, so we can stop our sync.
                LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (presync phase)\n", m_id, m_current_height);
            }
        }
    } else if (m_download_state == State::REDOWNLOAD) {
        // During REDOWNLOAD, we compare our stored commitments to what we
        // receive, and add headers to our redownload buffer. When the buffer
        // gets big enough (meaning that we've checked enough commitments),
        // we'll return a batch of headers to the caller for processing.
        ret.success = true;
        for (const auto& hdr : received_headers) {
            if (!ValidateAndStoreRedownloadedHeader(hdr)) {
                // Something went wrong -- the peer gave us an unexpected chain.
                // We could consider looking at the reason for failure and
                // punishing the peer, but for now just give up on sync.
                ret.success = false;
                break;
            }
        }

        if (ret.success) {
            // Return any headers that are ready for acceptance.
            ret.pow_validated_headers = PopHeadersReadyForAcceptance();

            // If we hit our target blockhash, then all remaining headers will be
            // returned and we can clear any leftover internal state.
            if (m_redownloaded_headers.empty() && m_process_all_remaining_headers) {
                LogDebug(BCLog::NET, "Initial headers sync complete with peer=%d: releasing all at height=%i (redownload phase)\n", m_id, m_redownload_buffer_last_height);
            } else if (full_headers_message) {
                // If the headers message is full, we need to request more.
                ret.request_more = true;
            } else {
                // For some reason our peer gave us a high-work chain, but is now
                // declining to serve us that full chain again. Give up.
                // Note that there's no more processing to be done with these
                // headers, so we can still return success.
                LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (redownload phase)\n", m_id, m_redownload_buffer_last_height);
            }
        }
    }

    if (!(ret.success && ret.request_more)) Finalize();
    return ret;
}